

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

kp_error_t list_dir(kp_ctx *ctx,char *root,char *indent,_Bool print_path)

{
  kp_error_t kVar1;
  int *nsafes_00;
  size_t sVar2;
  undefined1 in_CL;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t ignore;
  int i;
  int nsafes;
  char **safes;
  kp_error_t ret;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar6;
  
  uVar6 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  iVar5 = 0;
  uVar3 = 0;
  nsafes_00 = (int *)calloc(0,8);
  kVar1 = list_dir_r((char ***)CONCAT44(uVar6,in_stack_ffffffffffffffe0),nsafes_00,
                     (char *)CONCAT44(iVar5,uVar3));
  if (kVar1 == 0) {
    qsort(nsafes_00,(long)iVar5,8,path_sort);
    if ((uVar6 & 0x1000000) != 0) {
      sVar2 = strlen((char *)(in_RDI + 4));
      printf("%s/\n",in_RSI + sVar2 + 1);
    }
    sVar2 = strlen(in_RSI);
    for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      printf("%s%s\n",in_RDX,*(long *)(nsafes_00 + (long)iVar4 * 2) + sVar2 + 1);
    }
  }
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    free(*(void **)(nsafes_00 + (long)iVar4 * 2));
  }
  free(nsafes_00);
  return kVar1;
}

Assistant:

static kp_error_t
list_dir(struct kp_ctx *ctx, char *root, char *indent, bool print_path)
{
	kp_error_t ret;
	char **safes = NULL;
	int nsafes = 0, i = 0;
	size_t ignore;

	safes = calloc(nsafes, sizeof(char *));

	if ((ret = list_dir_r(&safes, &nsafes, root)) != KP_SUCCESS) {
		goto out;
	}

	qsort(safes, nsafes, sizeof(char *), path_sort);

	if (print_path) {
		printf("%s/\n", root + strlen(ctx->ws_path) + 1);
	}
	ignore = strlen(root) + 1;
	for (i = 0; i < nsafes; i++) {
		printf("%s%s\n", indent, safes[i] + ignore);
	}

out:
	for (i = 0; i < nsafes; i++) {
		free(safes[i]);
	}
	free(safes);

	return ret;
}